

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void PStruct::WriteFields(FArchive *ar,void *addr,TArray<PField_*,_PField_*> *fields)

{
  PField *pPVar1;
  uint i;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < fields->Count; uVar2 = uVar2 + 1) {
    pPVar1 = fields->Array[uVar2];
    if ((pPVar1->Flags & 8) == 0) {
      FArchive::WriteName(ar,FName::NameData.NameArray
                             [*(int *)&(pPVar1->super_PSymbol).super_DObject.field_0x24].Text);
      (*(pPVar1->Type->super_DObject)._vptr_DObject[7])
                (pPVar1->Type,ar,(ulong)pPVar1->Offset + (long)addr);
    }
  }
  FArchive::WriteName(ar,(char *)0x0);
  return;
}

Assistant:

void PStruct::WriteFields(FArchive &ar, const void *addr, const TArray<PField *> &fields)
{
	for (unsigned i = 0; i < fields.Size(); ++i)
	{
		const PField *field = fields[i];
		// Skip fields with native serialization
		if (!(field->Flags & VARF_Native))
		{
			ar.WriteName(field->SymbolName);
			field->Type->WriteValue(ar, (const BYTE *)addr + field->Offset);
		}
	}
	ar.WriteName(NULL);
}